

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusStencilOp::emulate_mthd(MthdCelsiusStencilOp *this)

{
  uint32_t uVar1;
  int local_18;
  uint local_14;
  uint32_t rv;
  uint32_t err;
  MthdCelsiusStencilOp *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c
            << 0x37) < 0) {
    local_14 = 4;
  }
  local_18 = 0;
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (uVar1 == 0) {
    local_18 = 2;
  }
  else if (uVar1 == 0x150a) {
    local_18 = 6;
  }
  else if (uVar1 == 0x1e00) {
    local_18 = 1;
  }
  else if (uVar1 == 0x1e01) {
    local_18 = 3;
  }
  else if (uVar1 == 0x1e02) {
    local_18 = 4;
  }
  else if (uVar1 == 0x1e03) {
    local_18 = 5;
  }
  else if (uVar1 == 0x8507) {
    local_18 = 7;
  }
  else if (uVar1 == 0x8508) {
    local_18 = 8;
  }
  else {
    local_14 = local_14 | 1;
  }
  if (local_14 == 0) {
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource
                   << 0x3e)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b &
           ((uint)(0xfL << ((byte)(this->which << 2) & 0x3f)) ^ 0xffffffff) |
           local_18 << ((byte)(this->which << 2) & 0x3f);
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1e,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_stencil_b,true);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0:
				rv = 2;
				break;
			case 0x150a:
				rv = 6;
				break;
			case 0x1e00:
				rv = 1;
				break;
			case 0x1e01:
				rv = 3;
				break;
			case 0x1e02:
				rv = 4;
				break;
			case 0x1e03:
				rv = 5;
				break;
			case 0x8507:
				rv = 7;
				break;
			case 0x8508:
				rv = 8;
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_stencil_b, 4 * which, 4, rv);
				pgraph_celsius_icmd(&exp, 0x1e, exp.bundle_stencil_b, true);
			}
		}
	}